

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::DoTrackNewValueForKills(GlobOpt *this,Value *value)

{
  ValueType *this_00;
  ValueInfo *this_01;
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ValueType VVar6;
  undefined4 *puVar7;
  BasicBlock *pBVar8;
  Loop *loop;
  GlobOpt *pGVar9;
  Value *local_48;
  Value *value_local;
  GlobOpt *local_38;
  
  local_48 = value;
  local_38 = this;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3258,"(value)","value");
    if (!bVar3) goto LAB_0043e80b;
    *puVar7 = 0;
  }
  this_01 = value->valueInfo;
  this_00 = &this_01->super_ValueType;
  bVar3 = ValueType::IsAnyOptimizedArray(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x325b,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar3) goto LAB_0043e80b;
    *puVar7 = 0;
  }
  bVar3 = ValueInfo::IsArrayValueInfo(this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x325c,"(!valueInfo->IsArrayValueInfo())","!valueInfo->IsArrayValueInfo()");
    if (!bVar3) goto LAB_0043e80b;
    *puVar7 = 0;
  }
  if (this_01->symStore != (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x325f,"(!valueInfo->GetSymStore())","!valueInfo->GetSymStore()");
    if (!bVar3) goto LAB_0043e80b;
    *puVar7 = 0;
  }
  bVar3 = ValueType::IsArrayOrObjectWithArray(this_00);
  bVar4 = ValueType::IsOptimizedTypedArray(this_00);
  if (bVar3 == bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3262,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar4) goto LAB_0043e80b;
    *puVar7 = 0;
  }
  bVar4 = ValueType::IsOptimizedVirtualTypedArray(this_00);
  pBVar8 = local_38->currentBlock;
  pBVar1 = pBVar8->next;
  if ((pBVar1 == (BasicBlock *)0x0) || ((*(ushort *)&pBVar1->field_0x18 & 5) != 4)) {
    loop = pBVar8->loop;
  }
  else {
    loop = pBVar1->loop;
    if (loop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      value_local = (Value *)__tls_get_addr(&PTR_013e5f18);
      value_local->valueNumber = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x326c,"(implicitCallsLoop)","implicitCallsLoop");
      if (!bVar5) goto LAB_0043e80b;
      value_local->valueNumber = 0;
      pBVar8 = local_38->currentBlock;
    }
    if (loop->landingPad != pBVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      value_local = (Value *)__tls_get_addr(&PTR_013e5f18);
      value_local->valueNumber = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x326d,"(implicitCallsLoop->landingPad == currentBlock)",
                         "implicitCallsLoop->landingPad == currentBlock");
      if (!bVar5) {
LAB_0043e80b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      value_local->valueNumber = 0;
    }
  }
  if (!bVar3 && !bVar4) {
    VerifyArrayValueInfoForTracking(local_38,this_01,false,local_38->currentBlock,false);
    return;
  }
  bVar5 = DoArrayCheckHoist(local_38,(ValueType)
                                     *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                      &(this_00->field_0).field_0,loop,(Instr *)0x0);
  pGVar9 = local_38;
  if (bVar5) {
    if (bVar3) {
      bVar3 = ValueType::HasNoMissingValues(this_00);
      if ((bVar3) && ((local_38->field_0xf5 & 0x80) == 0)) {
        VVar6 = ValueType::SetHasNoMissingValues(this_00,false);
        (this_00->field_0).field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar6.field_0;
      }
      pGVar9 = local_38;
      VerifyArrayValueInfoForTracking(local_38,this_01,true,local_38->currentBlock,false);
    }
    else {
      VerifyArrayValueInfoForTracking(local_38,this_01,false,local_38->currentBlock,false);
      if (!bVar4) {
        return;
      }
    }
    JsUtil::
    BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Add((pGVar9->currentBlock->globOptData).valuesToKillOnCalls,&local_48);
  }
  else {
    VVar6 = ValueType::ToLikely(this_00);
    (this_00->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar6.field_0;
  }
  return;
}

Assistant:

void
GlobOpt::DoTrackNewValueForKills(Value *const value)
{
    Assert(value);

    ValueInfo *const valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsAnyOptimizedArray());
    Assert(!valueInfo->IsArrayValueInfo());

    // The value and value info here are new, so it's okay to modify the value info in-place
    Assert(!valueInfo->GetSymStore());

    const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

    const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

    Loop *implicitCallsLoop;
    if(currentBlock->next && !currentBlock->next->isDeleted && currentBlock->next->isLoopHeader)
    {
        // Since a loop's landing pad does not have user code, determine whether disabling implicit calls is allowed in the
        // landing pad based on the loop for which this block is the landing pad.
        implicitCallsLoop = currentBlock->next->loop;
        Assert(implicitCallsLoop);
        Assert(implicitCallsLoop->landingPad == currentBlock);
    }
    else
    {
        implicitCallsLoop = currentBlock->loop;
    }

    if(isJsArray || isVirtualTypedArray)
    {
        if(!DoArrayCheckHoist(valueInfo->Type(), implicitCallsLoop))
        {
            // Array opts are disabled for this value type, so treat it as an indefinite value type going forward
            valueInfo->Type() = valueInfo->Type().ToLikely();
            return;
        }

        if(isJsArray && valueInfo->HasNoMissingValues() && !DoArrayMissingValueCheckHoist())
        {
            valueInfo->Type() = valueInfo->Type().SetHasNoMissingValues(false);
        }
    }

#if DBG
    VerifyArrayValueInfoForTracking(valueInfo, isJsArray, currentBlock);
#endif

    if(!isJsArray && !isVirtualTypedArray)
    {
        return;
    }

    // Can't assume going forward that it will definitely be an array without disabling implicit calls, because the
    // array may be transformed into an ES5 array. Since array opts are enabled, implicit calls can be disabled, and we can
    // treat it as a definite value type going forward, but the value needs to be tracked so that something like a call can
    // revert the value type to a likely version.
    CurrentBlockData()->valuesToKillOnCalls->Add(value);
}